

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall
re2::CharClassBuilder::AddRangeFlags(CharClassBuilder *this,Rune lo,Rune hi,ParseFlags parse_flags)

{
  ParseFlags PVar1;
  bool bVar2;
  bool cutnl;
  ParseFlags parse_flags_local;
  Rune hi_local;
  Rune lo_local;
  CharClassBuilder *this_local;
  
  PVar1 = operator&(parse_flags,ClassNL);
  bVar2 = true;
  if (PVar1 != NoParseFlags) {
    PVar1 = operator&(parse_flags,NeverNL);
    bVar2 = PVar1 != NoParseFlags;
  }
  if (((bVar2) && (lo < 0xb)) && (9 < hi)) {
    if (lo < 10) {
      AddRangeFlags(this,lo,9,parse_flags);
    }
    if (10 < hi) {
      AddRangeFlags(this,0xb,hi,parse_flags);
    }
  }
  else {
    PVar1 = operator&(parse_flags,FoldCase);
    if (PVar1 == NoParseFlags) {
      AddRange(this,lo,hi);
    }
    else {
      AddFoldedRange(this,lo,hi,0);
    }
  }
  return;
}

Assistant:

void CharClassBuilder::AddRangeFlags(
    Rune lo, Rune hi, Regexp::ParseFlags parse_flags) {

  // Take out \n if the flags say so.
  bool cutnl = !(parse_flags & Regexp::ClassNL) ||
               (parse_flags & Regexp::NeverNL);
  if (cutnl && lo <= '\n' && '\n' <= hi) {
    if (lo < '\n')
      AddRangeFlags(lo, '\n' - 1, parse_flags);
    if (hi > '\n')
      AddRangeFlags('\n' + 1, hi, parse_flags);
    return;
  }

  // If folding case, add fold-equivalent characters too.
  if (parse_flags & Regexp::FoldCase)
    AddFoldedRange(this, lo, hi, 0);
  else
    AddRange(lo, hi);
}